

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O2

char * nng_http_get_version(nng_http *conn)

{
  char *pcVar1;
  
  pcVar1 = nni_http_get_version(conn);
  return pcVar1;
}

Assistant:

const char *
nng_http_get_version(nng_http *conn)
{
#ifdef NNG_SUPP_HTTP
	return (nni_http_get_version(conn));
#else
	NNI_ARG_UNUSED(res);
	return (NULL);
#endif
}